

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

void __thiscall features::Surf::set_image(Surf *this,ConstPtr *image)

{
  int iVar1;
  ImageBase *pIVar2;
  invalid_argument *this_00;
  shared_ptr<const_core::Image<unsigned_char>_> local_68;
  shared_ptr<core::Image<long>_> local_58;
  shared_ptr<const_core::Image<unsigned_char>_> local_48;
  shared_ptr<core::Image<unsigned_char>_> local_38 [2];
  ConstPtr *local_18;
  ConstPtr *image_local;
  Surf *this_local;
  
  local_18 = image;
  image_local = (ConstPtr *)this;
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar1 = core::ImageBase::channels(pIVar2);
  if (iVar1 != 1) {
    pIVar2 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar1 = core::ImageBase::channels(pIVar2);
    if (iVar1 != 3) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Gray or color image expected");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar1 = core::ImageBase::channels(pIVar2);
  if (iVar1 == 3) {
    std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(&local_48,image);
    core::image::desaturate<unsigned_char>((image *)local_38,&local_48,DESATURATE_LIGHTNESS);
    std::shared_ptr<core::Image<unsigned_char>const>::operator=
              ((shared_ptr<core::Image<unsigned_char>const> *)image,local_38);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(local_38);
    std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_48);
  }
  std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(&local_68,image);
  core::image::integral_image<unsigned_char,long>((image *)&local_58,&local_68);
  std::shared_ptr<core::Image<long>_>::operator=(&this->sat,&local_58);
  std::shared_ptr<core::Image<long>_>::~shared_ptr(&local_58);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_68);
  return;
}

Assistant:

void
Surf::set_image (core::ByteImage::ConstPtr image)
{
    /* Desaturate input image. */
    if (image->channels() != 1 && image->channels() != 3)
        throw std::invalid_argument("Gray or color image expected");
    if (image->channels() == 3)
        image = core::image::desaturate<uint8_t>(image,
            core::image::DESATURATE_LIGHTNESS);

    /* Build summed area table (SAT). */
    //util::WallTimer timer;
    this->sat = core::image::integral_image<uint8_t,SatType>(image);
    //std::cout << "Creating SAT image took "
    //    << timer.get_elapsed() << " ms." << std::endl;
}